

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilityTestCase.cpp
# Opt level: O0

void __thiscall
SuiteUtilityTests::TestsocketGetSockOpt_TCPNoDelaySet_SocketSet::
~TestsocketGetSockOpt_TCPNoDelaySet_SocketSet(TestsocketGetSockOpt_TCPNoDelaySet_SocketSet *this)

{
  TestsocketGetSockOpt_TCPNoDelaySet_SocketSet *this_local;
  
  ~TestsocketGetSockOpt_TCPNoDelaySet_SocketSet(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(socketGetSockOpt_TCPNoDelaySet_SocketSet)
{
  int socket = 5000;
  int opt = TCP_NODELAY;
  int optval = 1;

  int actual = socket_getsockopt(socket, opt, optval);
  // -1 expected as not a real socket to connect to
  CHECK_EQUAL(-1, actual);
}